

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 normalizeRoundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,float_status *status)

{
  int iVar1;
  float128 fVar2;
  uint64_t local_48;
  uint64_t zSig2;
  float_status *pfStack_38;
  int8_t shiftCount;
  float_status *status_local;
  uint64_t zSig1_local;
  uint64_t zSig0_local;
  int32_t zExp_local;
  flag zSign_local;
  
  status_local = (float_status *)zSig1;
  zSig1_local = zSig0;
  zSig0_local._0_4_ = zExp;
  if (zSig0 == 0) {
    status_local = (float_status *)0x0;
    zSig0_local._0_4_ = zExp + -0x40;
    zSig1_local = zSig1;
  }
  pfStack_38 = status;
  zSig0_local._7_1_ = zSign;
  iVar1 = clz64(zSig1_local);
  zSig2._7_1_ = (char)iVar1 + -0xf;
  if (zSig2._7_1_ < '\0') {
    shift128ExtraRightJamming
              (zSig1_local,(uint64_t)status_local,0,-(int)zSig2._7_1_,&zSig1_local,
               (uint64_t *)&status_local,&local_48);
  }
  else {
    local_48 = 0;
    shortShift128Left(zSig1_local,(uint64_t)status_local,(int)zSig2._7_1_,&zSig1_local,
                      (uint64_t *)&status_local);
  }
  zSig0_local._0_4_ = (int32_t)zSig0_local - zSig2._7_1_;
  fVar2 = roundAndPackFloat128
                    (zSig0_local._7_1_,(int32_t)zSig0_local,zSig1_local,(uint64_t)status_local,
                     local_48,pfStack_38);
  return fVar2;
}

Assistant:

static float128 normalizeRoundAndPackFloat128(flag zSign, int32_t zExp,
                                              uint64_t zSig0, uint64_t zSig1,
                                              float_status *status)
{
    int8_t shiftCount;
    uint64_t zSig2;

    if ( zSig0 == 0 ) {
        zSig0 = zSig1;
        zSig1 = 0;
        zExp -= 64;
    }
    shiftCount = clz64(zSig0) - 15;
    if ( 0 <= shiftCount ) {
        zSig2 = 0;
        shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    }
    else {
        shift128ExtraRightJamming(
            zSig0, zSig1, 0, - shiftCount, &zSig0, &zSig1, &zSig2 );
    }
    zExp -= shiftCount;
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}